

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

void slang::setBits(uint64_t *dest,uint32_t destOffset,uint32_t length)

{
  uint *puVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t i;
  uint32_t bitsToWrite;
  uint32_t BitsPerWord;
  uint local_20;
  uint local_1c [2];
  undefined4 local_14;
  uint local_10;
  uint local_c;
  ulong *local_8;
  
  if (in_EDX != 0) {
    local_14 = 0x40;
    local_8 = (ulong *)(in_RDI + (ulong)(in_ESI >> 6) * 8);
    local_c = in_ESI & 0x3f;
    local_10 = in_EDX;
    if (local_c != 0) {
      local_1c[0] = 0x40 - local_c;
      puVar1 = std::min<unsigned_int>(&local_10,local_1c);
      local_10 = local_10 - *puVar1;
      *local_8 = (1L << ((byte)*puVar1 & 0x3f)) + -1 << ((byte)local_c & 0x3f) | *local_8;
      local_8 = local_8 + 1;
    }
    for (local_20 = 0; local_20 < local_10 >> 6; local_20 = local_20 + 1) {
      *local_8 = 0xffffffffffffffff;
      local_8 = local_8 + 1;
    }
    if ((local_10 & 0x3f) != 0) {
      *local_8 = (1L << (sbyte)(local_10 & 0x3f)) - 1U | *local_8;
    }
  }
  return;
}

Assistant:

static void setBits(uint64_t* dest, uint32_t destOffset, uint32_t length) {
    if (length == 0)
        return;

    // Get the first word we want to write to, and the remaining bits are an offset.
    const uint32_t BitsPerWord = SVInt::BITS_PER_WORD;
    dest += destOffset / BitsPerWord;
    destOffset %= BitsPerWord;

    // Writing to the first word is a special case, due to the bit offset
    if (destOffset) {
        uint32_t bitsToWrite = std::min(length, BitsPerWord - destOffset);
        length -= bitsToWrite;

        *dest |= ((1ull << bitsToWrite) - 1) << destOffset;
        dest++;
    }

    // Do a bulk set of whole words, with all writes to dest word-aligned.
    for (uint32_t i = 0; i < length / BitsPerWord; i++)
        *dest++ = UINT64_MAX;

    // Handle leftover bits in the final word.
    if (length %= BitsPerWord)
        *dest |= (1ull << length) - 1;
}